

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

SASL_OUTCOME_HANDLE sasl_outcome_create(sasl_code code_value)

{
  int iVar1;
  SASL_OUTCOME_INSTANCE_TAG SVar2;
  AMQP_VALUE item_value;
  undefined4 local_24;
  int result;
  AMQP_VALUE code_amqp_value;
  SASL_OUTCOME_INSTANCE *sasl_outcome_instance;
  sasl_code code_value_local;
  
  code_amqp_value = (AMQP_VALUE)malloc(8);
  if (code_amqp_value != (AMQP_VALUE)0x0) {
    SVar2.composite_value = amqpvalue_create_composite_with_ulong_descriptor(0x44);
    *(AMQP_VALUE *)code_amqp_value = SVar2.composite_value;
    if (*(AMQP_VALUE *)code_amqp_value == (AMQP_VALUE)0x0) {
      free(code_amqp_value);
      code_amqp_value = (AMQP_VALUE)0x0;
    }
    else {
      local_24 = 0;
      item_value = amqpvalue_create_sasl_code(code_value);
      iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)code_amqp_value,0,item_value);
      if (iVar1 != 0) {
        local_24 = 0x2d29;
      }
      amqpvalue_destroy(item_value);
      if (local_24 != 0) {
        sasl_outcome_destroy((SASL_OUTCOME_HANDLE)code_amqp_value);
        code_amqp_value = (AMQP_VALUE)0x0;
      }
    }
  }
  return (SASL_OUTCOME_HANDLE)code_amqp_value;
}

Assistant:

SASL_OUTCOME_HANDLE sasl_outcome_create(sasl_code code_value)
{
    SASL_OUTCOME_INSTANCE* sasl_outcome_instance = (SASL_OUTCOME_INSTANCE*)malloc(sizeof(SASL_OUTCOME_INSTANCE));
    if (sasl_outcome_instance != NULL)
    {
        sasl_outcome_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(68);
        if (sasl_outcome_instance->composite_value == NULL)
        {
            free(sasl_outcome_instance);
            sasl_outcome_instance = NULL;
        }
        else
        {
            AMQP_VALUE code_amqp_value;
            int result = 0;

            code_amqp_value = amqpvalue_create_sasl_code(code_value);
            if ((result == 0) && (amqpvalue_set_composite_item(sasl_outcome_instance->composite_value, 0, code_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(code_amqp_value);
            if (result != 0)
            {
                sasl_outcome_destroy(sasl_outcome_instance);
                sasl_outcome_instance = NULL;
            }
        }
    }

    return sasl_outcome_instance;
}